

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsTranslation(ON_Xform *this,double zero_tolerance)

{
  bool bVar1;
  
  if (((((0.0 <= zero_tolerance) && (zero_tolerance < 1.23432101234321e+308)) &&
       (ABS(1.0 - this->m_xform[0][0]) <= zero_tolerance)) &&
      (((ABS(this->m_xform[0][1]) <= zero_tolerance && (ABS(this->m_xform[0][2]) <= zero_tolerance))
       && ((ABS(this->m_xform[1][0]) <= zero_tolerance &&
           ((ABS(1.0 - this->m_xform[1][1]) <= zero_tolerance &&
            (ABS(this->m_xform[1][2]) <= zero_tolerance)))))))) &&
     ((ABS(this->m_xform[2][0]) <= zero_tolerance &&
      (((((ABS(this->m_xform[2][1]) <= zero_tolerance &&
          (ABS(1.0 - this->m_xform[2][2]) <= zero_tolerance)) &&
         (ABS(this->m_xform[3][0]) <= zero_tolerance)) &&
        ((ABS(this->m_xform[3][1]) <= zero_tolerance && (ABS(this->m_xform[3][2]) <= zero_tolerance)
         ))) && (ABS(1.0 - this->m_xform[3][3]) <= zero_tolerance)))))) {
    bVar1 = IsValid(this);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_Xform::IsTranslation( double zero_tolerance ) const
{
  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  const double* v = &m_xform[0][0];
  if ( fabs(1.0 - *v++) > zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  v++;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(1.0 - *v++) > zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  v++;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(1.0 - *v++) > zero_tolerance )
    return false;
  v++;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs(*v++) >  zero_tolerance )
    return false;
  if ( fabs( 1.0 - *v ) > zero_tolerance )
    return false;

  return IsValid();
}